

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

sfxinfo_t * S_LoadSound(sfxinfo_t *sfx)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  sfxinfo_t *psVar6;
  char *pcVar7;
  char *pcVar8;
  BYTE *sfxdata_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<SoundHandle,_bool> pVar9;
  pair<SoundHandle,_bool> local_f8;
  void *local_e8;
  pair<SoundHandle,_bool> local_d8;
  uint local_c4;
  void *pvStack_c0;
  int frequency;
  pair<SoundHandle,_bool> local_b0;
  void *local_a0;
  undefined1 local_98;
  pair<SoundHandle,_bool> local_90;
  undefined1 local_80 [8];
  pair<SoundHandle,_bool> snd;
  SDWORD dmxlen;
  BYTE *sfxdata;
  FWadLump wlump;
  int size;
  uint i;
  sfxinfo_t *sfx_local;
  
  uVar3 = (*GSnd->_vptr_SoundRenderer[2])();
  if ((uVar3 & 1) == 0) {
    while (bVar2 = SoundHandle::isValid(&sfx->data), ((bVar2 ^ 0xffU) & 1) != 0) {
      if (sfx->lumpnum == -1) {
        sfx->lumpnum = sfx_empty;
      }
      for (wlump.Lump._4_4_ = 0; uVar3 = wlump.Lump._4_4_,
          uVar4 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx), uVar3 < uVar4;
          wlump.Lump._4_4_ = wlump.Lump._4_4_ + 1) {
        psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)wlump.Lump._4_4_);
        bVar2 = SoundHandle::isValid(&psVar6->data);
        if (((bVar2) &&
            (psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)wlump.Lump._4_4_),
            psVar6->link == 0xffffffff)) &&
           (psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)wlump.Lump._4_4_),
           psVar6->lumpnum == sfx->lumpnum)) {
          pcVar7 = FString::GetChars(&sfx->name);
          psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)wlump.Lump._4_4_);
          pcVar8 = FString::GetChars(&psVar6->name);
          DPrintf(3,"Linked %s to %s (%d)\n",pcVar7,pcVar8,(ulong)wlump.Lump._4_4_);
          sfx->link = wlump.Lump._4_4_;
          fVar1 = (sfx->Rolloff).MinDistance;
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            fVar1 = S_Rolloff.MinDistance;
            (sfx->Rolloff).RolloffType = S_Rolloff.RolloffType;
            (sfx->Rolloff).MinDistance = fVar1;
            (sfx->Rolloff).field_2 = S_Rolloff.field_2;
          }
          psVar6 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)wlump.Lump._4_4_);
          return psVar6;
        }
      }
      pcVar7 = FString::GetChars(&sfx->name);
      TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,0);
      DPrintf(3,"Loading sound \"%s\" (%td)\n",pcVar7);
      wlump.Lump._0_4_ = FWadCollection::LumpLength(&Wads,sfx->lumpnum);
      if (0 < (int)(uint)wlump.Lump) {
        FWadCollection::OpenLumpNum((FWadLump *)&sfxdata,&Wads,sfx->lumpnum);
        sfxdata_00 = (BYTE *)operator_new__((long)(int)(uint)wlump.Lump);
        FWadLump::Read((FWadLump *)&sfxdata,sfxdata_00,(long)(int)(uint)wlump.Lump);
        snd.second = (bool)sfxdata_00[4];
        snd._9_1_ = sfxdata_00[5];
        snd._10_1_ = sfxdata_00[6];
        snd._11_1_ = sfxdata_00[7];
        std::pair<SoundHandle,_bool>::pair<SoundHandle,_bool,_true>
                  ((pair<SoundHandle,_bool> *)local_80);
        iVar5 = strncmp((char *)sfxdata_00,"Creative Voice File",0x13);
        if (iVar5 == 0) {
          pVar9 = SoundRenderer::LoadSoundVoc(GSnd,sfxdata_00,(uint)wlump.Lump,false);
          local_a0 = (void *)pVar9.first.data;
          local_98 = pVar9.second;
          local_90.first.data = local_a0;
          local_90.second = (bool)local_98;
          std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_80,&local_90);
        }
        else if ((*(ushort *)&sfx->field_0x30 >> 2 & 1) == 0) {
          if (((*sfxdata_00 == '\x03') && (sfxdata_00[1] == '\0')) &&
             ((int)snd._8_4_ <= (int)((uint)wlump.Lump - 8))) {
            local_c4 = (uint)*(ushort *)(sfxdata_00 + 2);
            if (local_c4 == 0) {
              local_c4 = 0x2b11;
            }
            iVar5 = (*GSnd->_vptr_SoundRenderer[6])
                              (GSnd,sfxdata_00 + 8,(ulong)(uint)snd._8_4_,(ulong)local_c4,1,8,
                               sfx->LoopStart,0xffffffff,0);
            local_e8 = (void *)CONCAT44(extraout_var_00,iVar5);
            local_d8.first.data = local_e8;
            std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_80,&local_d8);
          }
          else {
            iVar5 = (*GSnd->_vptr_SoundRenderer[5])(GSnd,sfxdata_00,(ulong)(uint)wlump.Lump,0);
            local_f8.first.data = (void *)CONCAT44(extraout_var_01,iVar5);
            std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_80,&local_f8);
          }
        }
        else {
          iVar5 = (*GSnd->_vptr_SoundRenderer[6])
                            (GSnd,sfxdata_00,(ulong)(uint)wlump.Lump,(ulong)sfx->RawRate,1,8,
                             sfx->LoopStart,0xffffffff,0);
          pvStack_c0 = (void *)CONCAT44(extraout_var,iVar5);
          local_b0.first.data = pvStack_c0;
          std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_80,&local_b0);
        }
        if (sfxdata_00 != (BYTE *)0x0) {
          operator_delete__(sfxdata_00);
        }
        (sfx->data).data = (void *)local_80;
        if (((byte)snd.first.data & 1) != 0) {
          (sfx->data3d).data = (sfx->data).data;
        }
        FWadLump::~FWadLump((FWadLump *)&sfxdata);
      }
      bVar2 = SoundHandle::isValid(&sfx->data);
      if (bVar2) {
        return sfx;
      }
      if (sfx->lumpnum == sfx_empty) {
        return sfx;
      }
      sfx->lumpnum = sfx_empty;
    }
  }
  return sfx;
}

Assistant:

sfxinfo_t *S_LoadSound(sfxinfo_t *sfx)
{
	if (GSnd->IsNull()) return sfx;

	while (!sfx->data.isValid())
	{
		unsigned int i;

		// If the sound doesn't exist, replace it with the empty sound.
		if (sfx->lumpnum == -1)
		{
			sfx->lumpnum = sfx_empty;
		}
		
		// See if there is another sound already initialized with this lump. If so,
		// then set this one up as a link, and don't load the sound again.
		for (i = 0; i < S_sfx.Size(); i++)
		{
			if (S_sfx[i].data.isValid() && S_sfx[i].link == sfxinfo_t::NO_LINK && S_sfx[i].lumpnum == sfx->lumpnum)
			{
				DPrintf (DMSG_NOTIFY, "Linked %s to %s (%d)\n", sfx->name.GetChars(), S_sfx[i].name.GetChars(), i);
				sfx->link = i;
				// This is necessary to avoid using the rolloff settings of the linked sound if its
				// settings are different.
				if (sfx->Rolloff.MinDistance == 0) sfx->Rolloff = S_Rolloff;
				return &S_sfx[i];
			}
		}

		DPrintf(DMSG_NOTIFY, "Loading sound \"%s\" (%td)\n", sfx->name.GetChars(), sfx - &S_sfx[0]);

		int size = Wads.LumpLength(sfx->lumpnum);
		if (size > 0)
		{
			FWadLump wlump = Wads.OpenLumpNum(sfx->lumpnum);
			BYTE *sfxdata = new BYTE[size];
			wlump.Read(sfxdata, size);
			SDWORD dmxlen = LittleLong(((SDWORD *)sfxdata)[1]);
            std::pair<SoundHandle,bool> snd;

			// If the sound is voc, use the custom loader.
			if (strncmp ((const char *)sfxdata, "Creative Voice File", 19) == 0)
			{
				snd = GSnd->LoadSoundVoc(sfxdata, size);
			}
			// If the sound is raw, just load it as such.
			else if (sfx->bLoadRAW)
			{
				snd = GSnd->LoadSoundRaw(sfxdata, size, sfx->RawRate, 1, 8, sfx->LoopStart);
			}
			// Otherwise, try the sound as DMX format.
			else if (((BYTE *)sfxdata)[0] == 3 && ((BYTE *)sfxdata)[1] == 0 && dmxlen <= size - 8)
			{
				int frequency = LittleShort(((WORD *)sfxdata)[1]);
				if (frequency == 0) frequency = 11025;
				snd = GSnd->LoadSoundRaw(sfxdata+8, dmxlen, frequency, 1, 8, sfx->LoopStart);
			}
			// If that fails, let the sound system try and figure it out.
			else
			{
				snd = GSnd->LoadSound(sfxdata, size);
			}
			delete[] sfxdata;

            sfx->data = snd.first;
            if(snd.second)
                sfx->data3d = sfx->data;
		}

		if (!sfx->data.isValid())
		{
			if (sfx->lumpnum != sfx_empty)
			{
				sfx->lumpnum = sfx_empty;
				continue;
			}
		}
		break;
	}
	return sfx;
}